

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O3

void av1_fill_mode_rates(AV1_COMMON *cm,ModeCosts *mode_costs,FRAME_CONTEXT *fc)

{
  int (*paaiVar1) [2] [16];
  int (*costs) [2] [16];
  int *piVar2;
  int *piVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  int (*paaiVar11) [13] [13];
  ulong uVar12;
  int (*paaiVar13) [3] [5];
  int (*paaiVar14) [6] [2];
  int (*paaiVar15) [3] [3];
  int (*paaiVar16) [3] [2];
  bool bVar17;
  int (*paaaiVar18) [4] [13] [16];
  int (*paaaiVar19) [4] [13] [16];
  ModeCosts *pMVar20;
  int (*costs_00) [13] [13];
  int (*costs_01) [13];
  int (*costs_02) [13] [14];
  int (*paiVar21) [3];
  int (*paaiVar22) [3] [2];
  aom_cdf_prob (*cdf) [5] [9];
  int (*costs_03) [3] [5];
  aom_cdf_prob (*paaaVar23) [4] [17];
  aom_cdf_prob (*cdf_00) [4] [17];
  int (*costs_04) [7];
  int (*costs_05) [8];
  segmentation_probs *cdf_01;
  int (*paiVar24) [2];
  aom_cdf_prob (*cdf_02) [17];
  aom_cdf_prob (*paaVar25) [3];
  long lVar26;
  int (*paaiVar27) [4] [16];
  int (*costs_06) [4] [16];
  int (*costs_07) [4] [13] [16];
  aom_cdf_prob (*cdf_03) [5];
  long lVar28;
  aom_cdf_prob (*paaaVar29) [5] [14];
  aom_cdf_prob (*paaaVar30) [5] [9];
  aom_cdf_prob (*paaaVar31) [3] [4];
  long lVar32;
  aom_cdf_prob (*paaaVar33) [6] [3];
  aom_cdf_prob (*paaaVar34) [3] [3];
  int (*paaiVar35) [2] [16];
  aom_cdf_prob (*paaaaVar36) [4] [13] [17];
  aom_cdf_prob (*paaaaVar37) [4] [13] [17];
  int (*costs_08) [6] [2];
  int (*costs_09) [3] [3];
  aom_cdf_prob (*cdf_04) [9];
  int (*paiVar38) [16];
  aom_cdf_prob (*cdf_05) [4];
  int sign_cost [8];
  long local_90;
  int local_58 [10];
  
  lVar28 = 0;
  pMVar20 = mode_costs;
  do {
    av1_cost_tokens_from_cdf
              ((int *)pMVar20,(aom_cdf_prob *)((long)fc->partition_cdf[0] + lVar28),(int *)0x0);
    lVar28 = lVar28 + 0x16;
    pMVar20 = (ModeCosts *)(pMVar20->partition_cost + 1);
  } while (lVar28 != 0x1b8);
  if ((cm->current_frame).skip_mode_info.skip_mode_flag != 0) {
    paaVar25 = fc->skip_mode_cdfs;
    lVar28 = 0;
    do {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->skip_mode_cost[0] + lVar28),*paaVar25,(int *)0x0);
      paaVar25 = paaVar25 + 1;
      lVar28 = lVar28 + 8;
    } while (lVar28 != 0x18);
  }
  paaVar25 = fc->skip_txfm_cdfs;
  lVar28 = 0;
  do {
    av1_cost_tokens_from_cdf
              ((int *)((long)mode_costs->skip_txfm_cost[0] + lVar28),*paaVar25,(int *)0x0);
    paaVar25 = paaVar25 + 1;
    lVar28 = lVar28 + 8;
  } while (lVar28 != 0x18);
  paaiVar11 = mode_costs->y_mode_costs;
  paaaVar29 = fc->kf_y_cdf;
  lVar28 = 0;
  do {
    lVar26 = 0;
    costs_00 = paaiVar11;
    do {
      av1_cost_tokens_from_cdf
                ((int *)costs_00,(aom_cdf_prob *)((long)(*paaaVar29)[0] + lVar26),(int *)0x0);
      costs_00 = (int (*) [13] [13])(*costs_00 + 1);
      lVar26 = lVar26 + 0x1c;
    } while (lVar26 != 0x8c);
    lVar28 = lVar28 + 1;
    paaiVar11 = paaiVar11 + 1;
    paaaVar29 = paaaVar29 + 1;
  } while (lVar28 != 5);
  costs_01 = mode_costs->mbmode_cost;
  lVar28 = 0;
  do {
    av1_cost_tokens_from_cdf
              (*costs_01,(aom_cdf_prob *)((long)fc->y_mode_cdf[0] + lVar28),(int *)0x0);
    lVar28 = lVar28 + 0x1c;
    costs_01 = costs_01 + 1;
  } while (lVar28 != 0x70);
  lVar28 = 0;
  bVar8 = true;
  do {
    bVar17 = bVar8;
    costs_02 = mode_costs->intra_uv_mode_cost + lVar28;
    lVar26 = 0;
    do {
      av1_cost_tokens_from_cdf
                ((int *)costs_02,(aom_cdf_prob *)((long)fc->uv_mode_cdf[lVar28][0] + lVar26),
                 (int *)0x0);
      costs_02 = (int (*) [13] [14])(*costs_02 + 1);
      lVar26 = lVar26 + 0x1e;
    } while (lVar26 != 0x186);
    lVar28 = 1;
    bVar8 = false;
  } while (bVar17);
  uVar12 = 0;
  av1_cost_tokens_from_cdf(mode_costs->filter_intra_mode_cost,fc->filter_intra_mode_cdf,(int *)0x0);
  paiVar24 = mode_costs->filter_intra_cost;
  paaVar25 = fc->filter_intra_cdfs;
  do {
    if (((cm->seq_params->enable_filter_intra != '\0') && ((0x1f07ffUL >> (uVar12 & 0x3f) & 1) != 0)
        ) && ((0x2f0bffUL >> (uVar12 & 0x3f) & 1) != 0)) {
      av1_cost_tokens_from_cdf(*paiVar24,*paaVar25,(int *)0x0);
    }
    uVar12 = uVar12 + 1;
    paaVar25 = paaVar25 + 1;
    paiVar24 = paiVar24 + 1;
  } while (uVar12 != 0x16);
  paiVar21 = mode_costs->switchable_interp_costs;
  lVar28 = 0;
  do {
    av1_cost_tokens_from_cdf
              (*paiVar21,(aom_cdf_prob *)((long)fc->switchable_interp_cdf[0] + lVar28),(int *)0x0);
    lVar28 = lVar28 + 8;
    paiVar21 = paiVar21 + 1;
  } while (lVar28 != 0x80);
  paaiVar16 = mode_costs->palette_y_mode_cost;
  paaaVar34 = fc->palette_y_mode_cdf;
  lVar28 = 0;
  do {
    av1_cost_tokens_from_cdf
              (mode_costs->palette_y_size_cost[lVar28],fc->palette_y_size_cdf[lVar28],(int *)0x0);
    av1_cost_tokens_from_cdf
              (mode_costs->palette_uv_size_cost[lVar28],fc->palette_uv_size_cdf[lVar28],(int *)0x0);
    lVar26 = 0;
    paaiVar22 = paaiVar16;
    do {
      av1_cost_tokens_from_cdf
                ((int *)paaiVar22,(aom_cdf_prob *)((long)(*paaaVar34)[0] + lVar26),(int *)0x0);
      paaiVar22 = (int (*) [3] [2])(*paaiVar22 + 1);
      lVar26 = lVar26 + 6;
    } while (lVar26 != 0x12);
    lVar28 = lVar28 + 1;
    paaiVar16 = paaiVar16 + 1;
    paaaVar34 = paaaVar34 + 1;
  } while (lVar28 != 7);
  lVar28 = 0;
  av1_cost_tokens_from_cdf
            (mode_costs->palette_uv_mode_cost[0],fc->palette_uv_mode_cdf[0],(int *)0x0);
  av1_cost_tokens_from_cdf
            (mode_costs->palette_uv_mode_cost[1],fc->palette_uv_mode_cdf[1],(int *)0x0);
  paaaVar30 = fc->palette_y_color_index_cdf;
  pMVar20 = mode_costs;
  do {
    lVar26 = 0;
    cdf = paaaVar30;
    do {
      av1_cost_tokens_from_cdf
                ((int *)((long)pMVar20->palette_y_color_cost[0][0] + lVar26),(aom_cdf_prob *)cdf,
                 (int *)0x0);
      av1_cost_tokens_from_cdf
                ((int *)((long)pMVar20->palette_uv_color_cost[0][0] + lVar26),
                 (aom_cdf_prob *)(cdf + 7),(int *)0x0);
      lVar26 = lVar26 + 0x20;
      cdf = (aom_cdf_prob (*) [5] [9])(*cdf + 1);
    } while (lVar26 != 0xa0);
    lVar28 = lVar28 + 1;
    pMVar20 = (ModeCosts *)(pMVar20->partition_cost + 4);
    paaaVar30 = paaaVar30 + 1;
  } while (lVar28 != 7);
  av1_cost_tokens_from_cdf(local_58,fc->cfl_sign_cdf,(int *)0x0);
  paaiVar1 = mode_costs->cfl_cost;
  uVar12 = 0;
  paaiVar35 = paaiVar1;
  do {
    costs = paaiVar1 + uVar12;
    if (uVar12 < 2) {
      ((int *)((long)costs + 0))[0xc] = 0;
      ((int *)((long)costs + 0))[0xd] = 0;
      ((int *)((long)costs + 0))[0xe] = 0;
      ((int *)((long)costs + 0))[0xf] = 0;
      ((int *)((long)costs + 0))[8] = 0;
      ((int *)((long)costs + 0))[9] = 0;
      ((int *)((long)costs + 0))[10] = 0;
      ((int *)((long)costs + 0))[0xb] = 0;
      ((int *)((long)costs + 0))[4] = 0;
      ((int *)((long)costs + 0))[5] = 0;
      ((int *)((long)costs + 0))[6] = 0;
      ((int *)((long)costs + 0))[7] = 0;
      ((int *)((long)costs + 0))[0] = 0;
      ((int *)((long)costs + 0))[1] = 0;
      ((int *)((long)costs + 0))[2] = 0;
      ((int *)((long)costs + 0))[3] = 0;
    }
    else {
      av1_cost_tokens_from_cdf((int *)costs,fc->cfl_sign_cdf + uVar12 * 0x11 + -0x19,(int *)0x0);
    }
    paiVar38 = paaiVar1[uVar12] + 1;
    uVar4 = uVar12 + 1;
    uVar9 = (uint)((int)uVar4 * 0xb) >> 5;
    iVar10 = (int)uVar4 + uVar9 * -3;
    if (iVar10 == 0) {
      *(int *)((long)(paaiVar1[uVar12] + 1) + 0x30) = 0;
      *(int *)((long)(paaiVar1[uVar12] + 1) + 0x34) = 0;
      *(int *)((long)(paaiVar1[uVar12] + 1) + 0x38) = 0;
      *(int *)((long)(paaiVar1[uVar12] + 1) + 0x3c) = 0;
      *(int *)((long)(paaiVar1[uVar12] + 1) + 0x20) = 0;
      *(int *)((long)(paaiVar1[uVar12] + 1) + 0x24) = 0;
      *(int *)((long)(paaiVar1[uVar12] + 1) + 0x28) = 0;
      *(int *)((long)(paaiVar1[uVar12] + 1) + 0x2c) = 0;
      *(int *)((long)(paaiVar1[uVar12] + 1) + 0x10) = 0;
      *(int *)((long)(paaiVar1[uVar12] + 1) + 0x14) = 0;
      *(int *)((long)(paaiVar1[uVar12] + 1) + 0x18) = 0;
      *(int *)((long)(paaiVar1[uVar12] + 1) + 0x1c) = 0;
      *(int *)((long)paiVar38 + 0) = 0;
      *(int *)((long)paiVar38 + 4) = 0;
      *(int *)((long)(paaiVar1[uVar12] + 1) + 8) = 0;
      *(int *)((long)(paaiVar1[uVar12] + 1) + 0xc) = 0;
    }
    else {
      av1_cost_tokens_from_cdf
                (*paiVar38,fc->cfl_alpha_cdf[(int)(uVar9 + iVar10 * 3 + -3)],(int *)0x0);
    }
    iVar10 = local_58[uVar12];
    lVar28 = 0;
    do {
      piVar2 = (*paaiVar35)[0] + lVar28;
      iVar5 = piVar2[1];
      iVar6 = piVar2[2];
      iVar7 = piVar2[3];
      piVar3 = (*paaiVar35)[0] + lVar28;
      *piVar3 = *piVar2 + iVar10;
      piVar3[1] = iVar5 + iVar10;
      piVar3[2] = iVar6 + iVar10;
      piVar3[3] = iVar7 + iVar10;
      lVar28 = lVar28 + 4;
    } while (lVar28 != 0x10);
    paaiVar35 = paaiVar35 + 1;
    uVar12 = uVar4;
  } while (uVar4 != 8);
  paaiVar13 = mode_costs->tx_size_cost;
  paaaVar31 = fc->tx_size_cdf;
  lVar28 = 0;
  do {
    lVar26 = 0;
    costs_03 = paaiVar13;
    do {
      av1_cost_tokens_from_cdf
                ((int *)costs_03,(aom_cdf_prob *)((long)(*paaaVar31)[0] + lVar26),(int *)0x0);
      costs_03 = (int (*) [3] [5])(*costs_03 + 1);
      lVar26 = lVar26 + 8;
    } while (lVar26 != 0x18);
    lVar28 = lVar28 + 1;
    paaiVar13 = paaiVar13 + 1;
    paaaVar31 = paaaVar31 + 1;
  } while (lVar28 != 4);
  paiVar24 = mode_costs->txfm_partition_cost;
  lVar28 = 0;
  do {
    av1_cost_tokens_from_cdf
              (*paiVar24,(aom_cdf_prob *)((long)fc->txfm_partition_cdf[0] + lVar28),(int *)0x0);
    lVar28 = lVar28 + 6;
    paiVar24 = paiVar24 + 1;
  } while (lVar28 != 0x7e);
  paaiVar27 = mode_costs->inter_tx_type_costs + 1;
  paaaVar23 = fc->inter_ext_tx_cdf + 1;
  paaaiVar18 = mode_costs->intra_tx_type_costs + 1;
  paaaaVar36 = fc->intra_ext_tx_cdf + 1;
  lVar28 = 0x4fd340;
  local_90 = 0;
  do {
    lVar26 = 0;
    cdf_00 = paaaVar23;
    costs_06 = paaiVar27;
    do {
      if (*(int *)(lVar28 + lVar26 * 4) != 0) {
        av1_cost_tokens_from_cdf
                  ((int *)costs_06,(aom_cdf_prob *)cdf_00,
                   av1_ext_tx_inv[*(int *)((long)av1_ext_tx_set_idx_to_type[1] + lVar26 + 4)]);
      }
      lVar26 = lVar26 + 4;
      costs_06 = costs_06 + 1;
      cdf_00 = cdf_00 + 1;
    } while (lVar26 != 0xc);
    lVar26 = 1;
    paaaiVar19 = paaaiVar18;
    paaaaVar37 = paaaaVar36;
    do {
      if (use_intra_ext_tx_for_txsize[lVar26][local_90] != 0) {
        iVar10 = av1_ext_tx_set_idx_to_type[0][lVar26];
        lVar32 = 0;
        costs_07 = paaaiVar19;
        do {
          av1_cost_tokens_from_cdf
                    ((int *)costs_07,(aom_cdf_prob *)((long)(*paaaaVar37)[0][0] + lVar32),
                     av1_ext_tx_inv[iVar10]);
          costs_07 = (int (*) [4] [13] [16])((*costs_07)[0] + 1);
          lVar32 = lVar32 + 0x22;
        } while (lVar32 != 0x1ba);
      }
      lVar26 = lVar26 + 1;
      paaaiVar19 = paaaiVar19 + 1;
      paaaaVar37 = paaaaVar37 + 1;
    } while (lVar26 != 3);
    local_90 = local_90 + 1;
    lVar28 = lVar28 + 4;
    paaiVar27 = (int (*) [4] [16])(*paaiVar27 + 1);
    paaaVar23 = (aom_cdf_prob (*) [4] [17])(*paaaVar23 + 1);
    paaaiVar18 = (int (*) [4] [13] [16])(*paaaiVar18 + 1);
    paaaaVar36 = (aom_cdf_prob (*) [4] [13] [17])(*paaaaVar36 + 1);
  } while (local_90 != 4);
  costs_04 = mode_costs->angle_delta_cost;
  lVar28 = 0;
  do {
    av1_cost_tokens_from_cdf
              (*costs_04,(aom_cdf_prob *)((long)fc->angle_delta_cdf[0] + lVar28),(int *)0x0);
    lVar28 = lVar28 + 0x10;
    costs_04 = costs_04 + 1;
  } while (lVar28 != 0x80);
  lVar28 = 0;
  av1_cost_tokens_from_cdf(mode_costs->intrabc_cost,fc->intrabc_cdf,(int *)0x0);
  costs_05 = mode_costs->spatial_pred_cost;
  do {
    av1_cost_tokens_from_cdf
              (*costs_05,(aom_cdf_prob *)((long)(fc->seg).spatial_pred_seg_cdf[0] + lVar28),
               (int *)0x0);
    lVar28 = lVar28 + 0x12;
    costs_05 = costs_05 + 1;
  } while (lVar28 != 0x36);
  cdf_01 = &fc->seg;
  lVar28 = 0;
  do {
    av1_cost_tokens_from_cdf
              ((int *)((long)mode_costs->tmp_pred_cost[0] + lVar28),(aom_cdf_prob *)cdf_01,
               (int *)0x0);
    cdf_01 = (segmentation_probs *)(cdf_01->pred_cdf + 1);
    lVar28 = lVar28 + 8;
  } while (lVar28 != 0x18);
  if (((cm->current_frame).frame_type & 0xfd) != 0) {
    paiVar24 = mode_costs->comp_inter_cost;
    lVar28 = 0;
    do {
      av1_cost_tokens_from_cdf
                (*paiVar24,(aom_cdf_prob *)((long)fc->comp_inter_cdf[0] + lVar28),(int *)0x0);
      lVar28 = lVar28 + 6;
      paiVar24 = paiVar24 + 1;
    } while (lVar28 != 0x1e);
    paaiVar14 = mode_costs->single_ref_cost;
    paaaVar33 = fc->single_ref_cdf;
    lVar28 = 0;
    do {
      lVar26 = 0;
      costs_08 = paaiVar14;
      do {
        av1_cost_tokens_from_cdf
                  ((int *)costs_08,(aom_cdf_prob *)((long)(*paaaVar33)[0] + lVar26),(int *)0x0);
        costs_08 = (int (*) [6] [2])(*costs_08 + 1);
        lVar26 = lVar26 + 6;
      } while (lVar26 != 0x24);
      lVar28 = lVar28 + 1;
      paaiVar14 = paaiVar14 + 1;
      paaaVar33 = paaaVar33 + 1;
    } while (lVar28 != 3);
    paiVar21 = mode_costs->comp_ref_type_cost;
    lVar28 = 0;
    do {
      av1_cost_tokens_from_cdf
                (*paiVar21,(aom_cdf_prob *)((long)fc->comp_ref_type_cdf[0] + lVar28),(int *)0x0);
      lVar28 = lVar28 + 6;
      paiVar21 = paiVar21 + 1;
    } while (lVar28 != 0x1e);
    paaiVar15 = mode_costs->uni_comp_ref_cost;
    paaaVar34 = fc->uni_comp_ref_cdf;
    lVar28 = 0;
    do {
      lVar26 = 0;
      costs_09 = paaiVar15;
      do {
        av1_cost_tokens_from_cdf
                  ((int *)costs_09,(aom_cdf_prob *)((long)(*paaaVar34)[0] + lVar26),(int *)0x0);
        costs_09 = (int (*) [3] [3])(*costs_09 + 1);
        lVar26 = lVar26 + 6;
      } while (lVar26 != 0x12);
      lVar28 = lVar28 + 1;
      paaiVar15 = paaiVar15 + 1;
      paaaVar34 = paaaVar34 + 1;
    } while (lVar28 != 3);
    paaiVar16 = mode_costs->comp_ref_cost;
    paaaVar34 = fc->comp_ref_cdf;
    lVar28 = 0;
    do {
      lVar26 = 0;
      paaiVar22 = paaiVar16;
      do {
        av1_cost_tokens_from_cdf
                  ((int *)paaiVar22,(aom_cdf_prob *)((long)(*paaaVar34)[0] + lVar26),(int *)0x0);
        paaiVar22 = (int (*) [3] [2])(*paaiVar22 + 1);
        lVar26 = lVar26 + 6;
      } while (lVar26 != 0x12);
      lVar28 = lVar28 + 1;
      paaiVar16 = paaiVar16 + 1;
      paaaVar34 = paaaVar34 + 1;
    } while (lVar28 != 3);
    paaVar25 = fc->comp_bwdref_cdf[0] + 1;
    paiVar24 = mode_costs->comp_bwdref_cost[0] + 1;
    lVar28 = 3;
    do {
      av1_cost_tokens_from_cdf((int *)(paiVar24 + -1),(aom_cdf_prob *)(paaVar25 + -1),(int *)0x0);
      av1_cost_tokens_from_cdf(*paiVar24,*paaVar25,(int *)0x0);
      paaVar25 = paaVar25 + 2;
      paiVar24 = paiVar24 + 2;
      lVar28 = lVar28 + -1;
    } while (lVar28 != 0);
    paaVar25 = fc->intra_inter_cdf;
    lVar28 = 0;
    do {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->intra_inter_cost[0] + lVar28),*paaVar25,(int *)0x0);
      paaVar25 = paaVar25 + 1;
      lVar28 = lVar28 + 8;
    } while (lVar28 != 0x20);
    paaVar25 = fc->newmv_cdf;
    lVar28 = 0;
    do {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->newmv_mode_cost[0] + lVar28),*paaVar25,(int *)0x0);
      paaVar25 = paaVar25 + 1;
      lVar28 = lVar28 + 8;
    } while (lVar28 != 0x30);
    lVar28 = 0;
    av1_cost_tokens_from_cdf(mode_costs->zeromv_mode_cost[0],fc->zeromv_cdf[0],(int *)0x0);
    av1_cost_tokens_from_cdf(mode_costs->zeromv_mode_cost[1],fc->zeromv_cdf[1],(int *)0x0);
    paaVar25 = fc->refmv_cdf;
    do {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->refmv_mode_cost[0] + lVar28),*paaVar25,(int *)0x0);
      paaVar25 = paaVar25 + 1;
      lVar28 = lVar28 + 8;
    } while (lVar28 != 0x30);
    paaVar25 = fc->drl_cdf;
    lVar28 = 0;
    do {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->drl_mode_cost0[0] + lVar28),*paaVar25,(int *)0x0);
      paaVar25 = paaVar25 + 1;
      lVar28 = lVar28 + 8;
    } while (lVar28 != 0x18);
    cdf_04 = fc->inter_compound_mode_cdf;
    lVar28 = 0;
    do {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->inter_compound_mode_cost[0] + lVar28),*cdf_04,(int *)0x0)
      ;
      cdf_04 = cdf_04 + 1;
      lVar28 = lVar28 + 0x20;
    } while (lVar28 != 0x100);
    paaVar25 = fc->compound_type_cdf;
    lVar28 = 0;
    do {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->compound_type_cost[0] + lVar28),*paaVar25,(int *)0x0);
      paaVar25 = paaVar25 + 1;
      lVar28 = lVar28 + 8;
    } while (lVar28 != 0xb0);
    paiVar38 = mode_costs->wedge_idx_cost;
    cdf_02 = fc->wedge_idx_cdf;
    lVar28 = 0;
    do {
      if (0 < *(int *)((long)&av1_wedge_params_lookup[0].wedge_types + lVar28)) {
        av1_cost_tokens_from_cdf(*paiVar38,*cdf_02,(int *)0x0);
      }
      cdf_02 = cdf_02 + 1;
      paiVar38 = paiVar38 + 1;
      lVar28 = lVar28 + 0x20;
    } while (lVar28 != 0x2c0);
    paiVar24 = mode_costs->interintra_cost;
    paaVar25 = fc->interintra_cdf;
    cdf_03 = fc->interintra_mode_cdf;
    lVar28 = 0;
    do {
      av1_cost_tokens_from_cdf(*paiVar24,*paaVar25,(int *)0x0);
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->interintra_mode_cost[0] + lVar28),*cdf_03,(int *)0x0);
      cdf_03 = cdf_03 + 1;
      lVar28 = lVar28 + 0x10;
      paaVar25 = paaVar25 + 1;
      paiVar24 = paiVar24 + 1;
    } while (lVar28 != 0x40);
    paaVar25 = fc->wedge_interintra_cdf;
    lVar28 = 0;
    do {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->wedge_interintra_cost[0] + lVar28),*paaVar25,(int *)0x0);
      paaVar25 = paaVar25 + 1;
      lVar28 = lVar28 + 8;
    } while (lVar28 != 0xb0);
    cdf_05 = fc->motion_mode_cdf + 3;
    lVar28 = 0;
    do {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->motion_mode_cost[3] + lVar28),*cdf_05,(int *)0x0);
      cdf_05 = cdf_05 + 1;
      lVar28 = lVar28 + 0xc;
    } while (lVar28 != 0xe4);
    paiVar24 = mode_costs->motion_mode_cost1 + 3;
    lVar28 = 0;
    do {
      av1_cost_tokens_from_cdf
                (*paiVar24,(aom_cdf_prob *)((long)fc->obmc_cdf[3] + lVar28),(int *)0x0);
      lVar28 = lVar28 + 6;
      paiVar24 = paiVar24 + 1;
    } while (lVar28 != 0x72);
    paaVar25 = fc->compound_index_cdf;
    lVar28 = 0;
    do {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->comp_idx_cost[0] + lVar28),*paaVar25,(int *)0x0);
      paaVar25 = paaVar25 + 1;
      lVar28 = lVar28 + 8;
    } while (lVar28 != 0x30);
    paaVar25 = fc->comp_group_idx_cdf;
    lVar28 = 0;
    do {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->comp_group_idx_cost[0] + lVar28),*paaVar25,(int *)0x0);
      paaVar25 = paaVar25 + 1;
      lVar28 = lVar28 + 8;
    } while (lVar28 != 0x30);
  }
  return;
}

Assistant:

void av1_fill_mode_rates(AV1_COMMON *const cm, ModeCosts *mode_costs,
                         FRAME_CONTEXT *fc) {
  int i, j;

  for (i = 0; i < PARTITION_CONTEXTS; ++i)
    av1_cost_tokens_from_cdf(mode_costs->partition_cost[i],
                             fc->partition_cdf[i], NULL);

  if (cm->current_frame.skip_mode_info.skip_mode_flag) {
    for (i = 0; i < SKIP_MODE_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->skip_mode_cost[i],
                               fc->skip_mode_cdfs[i], NULL);
    }
  }

  for (i = 0; i < SKIP_CONTEXTS; ++i) {
    av1_cost_tokens_from_cdf(mode_costs->skip_txfm_cost[i],
                             fc->skip_txfm_cdfs[i], NULL);
  }

  for (i = 0; i < KF_MODE_CONTEXTS; ++i)
    for (j = 0; j < KF_MODE_CONTEXTS; ++j)
      av1_cost_tokens_from_cdf(mode_costs->y_mode_costs[i][j],
                               fc->kf_y_cdf[i][j], NULL);

  for (i = 0; i < BLOCK_SIZE_GROUPS; ++i)
    av1_cost_tokens_from_cdf(mode_costs->mbmode_cost[i], fc->y_mode_cdf[i],
                             NULL);
  for (i = 0; i < CFL_ALLOWED_TYPES; ++i)
    for (j = 0; j < INTRA_MODES; ++j)
      av1_cost_tokens_from_cdf(mode_costs->intra_uv_mode_cost[i][j],
                               fc->uv_mode_cdf[i][j], NULL);

  av1_cost_tokens_from_cdf(mode_costs->filter_intra_mode_cost,
                           fc->filter_intra_mode_cdf, NULL);
  for (i = 0; i < BLOCK_SIZES_ALL; ++i) {
    if (av1_filter_intra_allowed_bsize(cm, i))
      av1_cost_tokens_from_cdf(mode_costs->filter_intra_cost[i],
                               fc->filter_intra_cdfs[i], NULL);
  }

  for (i = 0; i < SWITCHABLE_FILTER_CONTEXTS; ++i)
    av1_cost_tokens_from_cdf(mode_costs->switchable_interp_costs[i],
                             fc->switchable_interp_cdf[i], NULL);

  for (i = 0; i < PALATTE_BSIZE_CTXS; ++i) {
    av1_cost_tokens_from_cdf(mode_costs->palette_y_size_cost[i],
                             fc->palette_y_size_cdf[i], NULL);
    av1_cost_tokens_from_cdf(mode_costs->palette_uv_size_cost[i],
                             fc->palette_uv_size_cdf[i], NULL);
    for (j = 0; j < PALETTE_Y_MODE_CONTEXTS; ++j) {
      av1_cost_tokens_from_cdf(mode_costs->palette_y_mode_cost[i][j],
                               fc->palette_y_mode_cdf[i][j], NULL);
    }
  }

  for (i = 0; i < PALETTE_UV_MODE_CONTEXTS; ++i) {
    av1_cost_tokens_from_cdf(mode_costs->palette_uv_mode_cost[i],
                             fc->palette_uv_mode_cdf[i], NULL);
  }

  for (i = 0; i < PALETTE_SIZES; ++i) {
    for (j = 0; j < PALETTE_COLOR_INDEX_CONTEXTS; ++j) {
      av1_cost_tokens_from_cdf(mode_costs->palette_y_color_cost[i][j],
                               fc->palette_y_color_index_cdf[i][j], NULL);
      av1_cost_tokens_from_cdf(mode_costs->palette_uv_color_cost[i][j],
                               fc->palette_uv_color_index_cdf[i][j], NULL);
    }
  }

  int sign_cost[CFL_JOINT_SIGNS];
  av1_cost_tokens_from_cdf(sign_cost, fc->cfl_sign_cdf, NULL);
  for (int joint_sign = 0; joint_sign < CFL_JOINT_SIGNS; joint_sign++) {
    int *cost_u = mode_costs->cfl_cost[joint_sign][CFL_PRED_U];
    int *cost_v = mode_costs->cfl_cost[joint_sign][CFL_PRED_V];
    if (CFL_SIGN_U(joint_sign) == CFL_SIGN_ZERO) {
      memset(cost_u, 0, CFL_ALPHABET_SIZE * sizeof(*cost_u));
    } else {
      const aom_cdf_prob *cdf_u = fc->cfl_alpha_cdf[CFL_CONTEXT_U(joint_sign)];
      av1_cost_tokens_from_cdf(cost_u, cdf_u, NULL);
    }
    if (CFL_SIGN_V(joint_sign) == CFL_SIGN_ZERO) {
      memset(cost_v, 0, CFL_ALPHABET_SIZE * sizeof(*cost_v));
    } else {
      const aom_cdf_prob *cdf_v = fc->cfl_alpha_cdf[CFL_CONTEXT_V(joint_sign)];
      av1_cost_tokens_from_cdf(cost_v, cdf_v, NULL);
    }
    for (int u = 0; u < CFL_ALPHABET_SIZE; u++)
      cost_u[u] += sign_cost[joint_sign];
  }

  for (i = 0; i < MAX_TX_CATS; ++i)
    for (j = 0; j < TX_SIZE_CONTEXTS; ++j)
      av1_cost_tokens_from_cdf(mode_costs->tx_size_cost[i][j],
                               fc->tx_size_cdf[i][j], NULL);

  for (i = 0; i < TXFM_PARTITION_CONTEXTS; ++i) {
    av1_cost_tokens_from_cdf(mode_costs->txfm_partition_cost[i],
                             fc->txfm_partition_cdf[i], NULL);
  }

  for (i = TX_4X4; i < EXT_TX_SIZES; ++i) {
    int s;
    for (s = 1; s < EXT_TX_SETS_INTER; ++s) {
      if (use_inter_ext_tx_for_txsize[s][i]) {
        av1_cost_tokens_from_cdf(
            mode_costs->inter_tx_type_costs[s][i], fc->inter_ext_tx_cdf[s][i],
            av1_ext_tx_inv[av1_ext_tx_set_idx_to_type[1][s]]);
      }
    }
    for (s = 1; s < EXT_TX_SETS_INTRA; ++s) {
      if (use_intra_ext_tx_for_txsize[s][i]) {
        for (j = 0; j < INTRA_MODES; ++j) {
          av1_cost_tokens_from_cdf(
              mode_costs->intra_tx_type_costs[s][i][j],
              fc->intra_ext_tx_cdf[s][i][j],
              av1_ext_tx_inv[av1_ext_tx_set_idx_to_type[0][s]]);
        }
      }
    }
  }
  for (i = 0; i < DIRECTIONAL_MODES; ++i) {
    av1_cost_tokens_from_cdf(mode_costs->angle_delta_cost[i],
                             fc->angle_delta_cdf[i], NULL);
  }
  av1_cost_tokens_from_cdf(mode_costs->intrabc_cost, fc->intrabc_cdf, NULL);

  for (i = 0; i < SPATIAL_PREDICTION_PROBS; ++i) {
    av1_cost_tokens_from_cdf(mode_costs->spatial_pred_cost[i],
                             fc->seg.spatial_pred_seg_cdf[i], NULL);
  }

  for (i = 0; i < SEG_TEMPORAL_PRED_CTXS; ++i) {
    av1_cost_tokens_from_cdf(mode_costs->tmp_pred_cost[i], fc->seg.pred_cdf[i],
                             NULL);
  }

  if (!frame_is_intra_only(cm)) {
    for (i = 0; i < COMP_INTER_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->comp_inter_cost[i],
                               fc->comp_inter_cdf[i], NULL);
    }

    for (i = 0; i < REF_CONTEXTS; ++i) {
      for (j = 0; j < SINGLE_REFS - 1; ++j) {
        av1_cost_tokens_from_cdf(mode_costs->single_ref_cost[i][j],
                                 fc->single_ref_cdf[i][j], NULL);
      }
    }

    for (i = 0; i < COMP_REF_TYPE_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->comp_ref_type_cost[i],
                               fc->comp_ref_type_cdf[i], NULL);
    }

    for (i = 0; i < UNI_COMP_REF_CONTEXTS; ++i) {
      for (j = 0; j < UNIDIR_COMP_REFS - 1; ++j) {
        av1_cost_tokens_from_cdf(mode_costs->uni_comp_ref_cost[i][j],
                                 fc->uni_comp_ref_cdf[i][j], NULL);
      }
    }

    for (i = 0; i < REF_CONTEXTS; ++i) {
      for (j = 0; j < FWD_REFS - 1; ++j) {
        av1_cost_tokens_from_cdf(mode_costs->comp_ref_cost[i][j],
                                 fc->comp_ref_cdf[i][j], NULL);
      }
    }

    for (i = 0; i < REF_CONTEXTS; ++i) {
      for (j = 0; j < BWD_REFS - 1; ++j) {
        av1_cost_tokens_from_cdf(mode_costs->comp_bwdref_cost[i][j],
                                 fc->comp_bwdref_cdf[i][j], NULL);
      }
    }

    for (i = 0; i < INTRA_INTER_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->intra_inter_cost[i],
                               fc->intra_inter_cdf[i], NULL);
    }

    for (i = 0; i < NEWMV_MODE_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->newmv_mode_cost[i], fc->newmv_cdf[i],
                               NULL);
    }

    for (i = 0; i < GLOBALMV_MODE_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->zeromv_mode_cost[i],
                               fc->zeromv_cdf[i], NULL);
    }

    for (i = 0; i < REFMV_MODE_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->refmv_mode_cost[i], fc->refmv_cdf[i],
                               NULL);
    }

    for (i = 0; i < DRL_MODE_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->drl_mode_cost0[i], fc->drl_cdf[i],
                               NULL);
    }
    for (i = 0; i < INTER_MODE_CONTEXTS; ++i)
      av1_cost_tokens_from_cdf(mode_costs->inter_compound_mode_cost[i],
                               fc->inter_compound_mode_cdf[i], NULL);
    for (i = 0; i < BLOCK_SIZES_ALL; ++i)
      av1_cost_tokens_from_cdf(mode_costs->compound_type_cost[i],
                               fc->compound_type_cdf[i], NULL);
    for (i = 0; i < BLOCK_SIZES_ALL; ++i) {
      if (av1_is_wedge_used(i)) {
        av1_cost_tokens_from_cdf(mode_costs->wedge_idx_cost[i],
                                 fc->wedge_idx_cdf[i], NULL);
      }
    }
    for (i = 0; i < BLOCK_SIZE_GROUPS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->interintra_cost[i],
                               fc->interintra_cdf[i], NULL);
      av1_cost_tokens_from_cdf(mode_costs->interintra_mode_cost[i],
                               fc->interintra_mode_cdf[i], NULL);
    }
    for (i = 0; i < BLOCK_SIZES_ALL; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->wedge_interintra_cost[i],
                               fc->wedge_interintra_cdf[i], NULL);
    }
    for (i = BLOCK_8X8; i < BLOCK_SIZES_ALL; i++) {
      av1_cost_tokens_from_cdf(mode_costs->motion_mode_cost[i],
                               fc->motion_mode_cdf[i], NULL);
    }
    for (i = BLOCK_8X8; i < BLOCK_SIZES_ALL; i++) {
      av1_cost_tokens_from_cdf(mode_costs->motion_mode_cost1[i],
                               fc->obmc_cdf[i], NULL);
    }
    for (i = 0; i < COMP_INDEX_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->comp_idx_cost[i],
                               fc->compound_index_cdf[i], NULL);
    }
    for (i = 0; i < COMP_GROUP_IDX_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->comp_group_idx_cost[i],
                               fc->comp_group_idx_cdf[i], NULL);
    }
  }
}